

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::SetVisible(LTAircraft *this,bool b)

{
  bool bVar1;
  logLevelTy lVar2;
  char *szMsg;
  undefined8 uVar3;
  byte in_SIL;
  Aircraft *in_RDI;
  undefined1 in_stack_ffffffffffffffdf;
  Aircraft *in_stack_ffffffffffffffe0;
  
  *(undefined1 *)
   ((long)&in_RDI[2].listInst.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
           _M_size + 3) = 0;
  *(byte *)((long)&in_RDI[2].listInst.super__List_base<void_*,_std::allocator<void_*>_>._M_impl.
                   _M_node._M_size + 2) = in_SIL & 1;
  bVar1 = XPMP2::Aircraft::IsVisible(in_RDI);
  if ((bool)(in_SIL & 1) != bVar1) {
    XPMP2::Aircraft::SetVisible(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 2) {
      bVar1 = XPMP2::Aircraft::IsVisible(in_RDI);
      szMsg = "A/c %s hidden";
      if (bVar1) {
        szMsg = "A/c %s visible";
      }
      uVar3 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x9db,"SetVisible",logINFO,szMsg,uVar3);
    }
  }
  return;
}

Assistant:

void LTAircraft::SetVisible (bool b)
{
    bAutoVisible = false;
    bSetVisible = b;
    if (b != IsVisible())       // is new visibility a change?
    {
        XPMP2::Aircraft::SetVisible(b);
        LOG_MSG(logINFO, IsVisible() ? INFO_AC_SHOWN : INFO_AC_HIDDEN,
                labelInternal.c_str());
    }
}